

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpring2Constraint.cpp
# Opt level: O0

bool btGeneric6DofSpring2Constraint::matrixToEulerZYX(btMatrix3x3 *mat,btVector3 *xyz)

{
  btScalar *pbVar1;
  btVector3 *in_RSI;
  btScalar bVar2;
  btScalar fi;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  bool local_1;
  
  bVar2 = btGetMatrixElem((btMatrix3x3 *)
                          CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          in_stack_ffffffffffffffbc);
  if (1.0 <= bVar2) {
    pbVar1 = btVector3::operator_cast_to_float_(in_RSI);
    *pbVar1 = 0.0;
    pbVar1 = btVector3::operator_cast_to_float_(in_RSI);
    pbVar1[1] = -1.5707964;
    bVar2 = btGetMatrixElem((btMatrix3x3 *)
                            CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                            in_stack_ffffffffffffffbc);
    btGetMatrixElem((btMatrix3x3 *)(CONCAT44(in_stack_ffffffffffffffc4,bVar2) ^ 0x80000000),
                    in_stack_ffffffffffffffbc);
    bVar2 = btAtan2(0.0,2.977716e-39);
    pbVar1 = btVector3::operator_cast_to_float_(in_RSI);
    pbVar1[2] = bVar2;
    local_1 = false;
  }
  else if (bVar2 <= -1.0) {
    pbVar1 = btVector3::operator_cast_to_float_(in_RSI);
    *pbVar1 = 0.0;
    pbVar1 = btVector3::operator_cast_to_float_(in_RSI);
    pbVar1[1] = 1.5707964;
    btGetMatrixElem((btMatrix3x3 *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                    in_stack_ffffffffffffffbc);
    btGetMatrixElem((btMatrix3x3 *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                    in_stack_ffffffffffffffbc);
    bVar2 = btAtan2(0.0,2.977483e-39);
    pbVar1 = btVector3::operator_cast_to_float_(in_RSI);
    pbVar1[2] = -bVar2;
    local_1 = false;
  }
  else {
    btGetMatrixElem((btMatrix3x3 *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                    in_stack_ffffffffffffffbc);
    btGetMatrixElem((btMatrix3x3 *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                    in_stack_ffffffffffffffbc);
    bVar2 = btAtan2(0.0,2.977119e-39);
    pbVar1 = btVector3::operator_cast_to_float_(in_RSI);
    *pbVar1 = bVar2;
    btGetMatrixElem((btMatrix3x3 *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                    in_stack_ffffffffffffffbc);
    bVar2 = btAsin(0.0);
    pbVar1 = btVector3::operator_cast_to_float_(in_RSI);
    pbVar1[1] = bVar2;
    btGetMatrixElem((btMatrix3x3 *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                    in_stack_ffffffffffffffbc);
    btGetMatrixElem((btMatrix3x3 *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                    in_stack_ffffffffffffffbc);
    bVar2 = btAtan2(0.0,2.977305e-39);
    pbVar1 = btVector3::operator_cast_to_float_(in_RSI);
    pbVar1[2] = bVar2;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool btGeneric6DofSpring2Constraint::matrixToEulerZYX(const btMatrix3x3& mat,btVector3& xyz)
{
	// rot =  cz*cy   cz*sy*sx-cx*sz   sz*sx+cz*cx*sy
	//        cy*sz   cz*cx+sz*sy*sx   cx*sz*sy-cz*sx
	//        -sy          cy*sx         cy*cx

	btScalar fi = btGetMatrixElem(mat,6);
	if (fi < btScalar(1.0f))
	{
		if (fi > btScalar(-1.0f))
		{
			xyz[0] = btAtan2(btGetMatrixElem(mat,7), btGetMatrixElem(mat,8));
			xyz[1] = btAsin(-btGetMatrixElem(mat,6));
			xyz[2] = btAtan2(btGetMatrixElem(mat,3),btGetMatrixElem(mat,0));
			return true;
		}
		else
		{
			xyz[0] = btScalar(0.0);
			xyz[1] = SIMD_HALF_PI;
			xyz[2] = -btAtan2(btGetMatrixElem(mat,1),btGetMatrixElem(mat,2));
			return false;
		}
	}
	else
	{
		xyz[0] = btScalar(0.0);
		xyz[1] = -SIMD_HALF_PI;
		xyz[2] = btAtan2(-btGetMatrixElem(mat,1),-btGetMatrixElem(mat,2));
	}
	return false;
}